

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Accuracy::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 wrapS;
  TestContext *testCtx;
  Context *pCVar1;
  RenderContext *renderCtx;
  ContextInfo *renderCtxInfo;
  TestNode *pTVar2;
  TestNode *node;
  TestNode *node_00;
  ostream *poVar3;
  Texture2DMipmapCase *this_00;
  long lVar4;
  long lVar5;
  undefined8 extraout_RAX;
  undefined8 uVar6;
  TextureCubeMipmapCase *this_01;
  undefined8 extraout_RAX_00;
  long lVar7;
  char *local_1c8 [4];
  ostringstream name;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,node);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    node_00 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node_00,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar5].name,init::coordTypes[lVar5].desc);
    tcu::TestNode::addChild(pTVar2,node_00);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar7 = 8; lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar3 = std::operator<<((ostream *)&name,init::minFilterModes[lVar4].name);
        poVar3 = std::operator<<(poVar3,"_");
        std::operator<<(poVar3,*(char **)(&UNK_00c09f98 + lVar7));
        this_00 = (Texture2DMipmapCase *)operator_new(0x100);
        testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        renderCtx = pCVar1->m_renderCtx;
        renderCtxInfo = pCVar1->m_contextInfo;
        std::__cxx11::stringbuf::str();
        wrapS = *(deUint32 *)((long)&init::wrapModes[0].name + lVar7);
        Texture2DMipmapCase::Texture2DMipmapCase
                  (this_00,testCtx,renderCtx,renderCtxInfo,local_1c8[0],"",
                   init::coordTypes[lVar5].type,init::minFilterModes[lVar4].mode,wrapS,wrapS,0x1908,
                   0x1401,0x40,0x40);
        tcu::TestNode::addChild(node_00,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
    }
  }
  uVar6 = 3;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[lVar5].name,init::cubeCoordTypes[lVar5].desc);
    tcu::TestNode::addChild(node,pTVar2);
    uVar6 = extraout_RAX;
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar1->m_renderCtx,pCVar1->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar4),"",
                 init::cubeCoordTypes[lVar5].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar4),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
      uVar6 = extraout_RAX_00;
    }
  }
  return (int)uVar6;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	const int tex2DWidth	= 64;
	const int tex2DHeight	= 64;

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				std::ostringstream name;
				name << minFilterModes[minFilter].name
						<< "_" << wrapModes[wrapMode].name;

				coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	name.str().c_str(), "",
																	coordTypes[coordType].type,
																	minFilterModes[minFilter].mode,
																	wrapModes[wrapMode].mode,
																	wrapModes[wrapMode].mode,
																	GL_RGBA, GL_UNSIGNED_BYTE,
																	tex2DWidth, tex2DHeight));
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}
}